

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cloud.c
# Opt level: O1

void Cloud_bddPrintCube(CloudManager *dd,CloudNode *bCube)

{
  uint uVar1;
  CloudNode *pCVar2;
  CloudNode *pCVar3;
  char *__format;
  CloudNode *pCVar4;
  bool bVar5;
  
  if ((*(uint *)(((ulong)bCube & 0xfffffffffffffffe) + 4) & 0xefffffff) == 0xfffffff) {
    __assert_fail("!Cloud_IsConstant(bCube)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/cloud.c"
                  ,0x388,"void Cloud_bddPrintCube(CloudManager *, CloudNode *)");
  }
  uVar1 = *(uint *)(((ulong)bCube & 0xfffffffffffffffe) + 4);
  do {
    if ((uVar1 & 0xefffffff) == 0xfffffff) {
      return;
    }
    pCVar4 = bCube->e;
    if (((ulong)bCube & 1) == 0) {
      pCVar3 = bCube->t;
    }
    else {
      pCVar4 = (CloudNode *)((ulong)pCVar4 ^ 1);
      pCVar3 = (CloudNode *)((ulong)bCube->t ^ 1);
    }
    pCVar2 = dd->zero;
    if (pCVar4 == pCVar2) {
      __format = "[%d]";
      if (pCVar3 == pCVar2) {
        __assert_fail("bCube1 != dd->zero",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/cloud.c"
                      ,0x3a3,"void Cloud_bddPrintCube(CloudManager *, CloudNode *)");
      }
    }
    else {
      __format = "[%d]\'";
      bVar5 = pCVar3 != pCVar2;
      pCVar3 = pCVar4;
      if (bVar5) {
        __assert_fail("bCube1 == dd->zero",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/cloud.c"
                      ,0x39d,"void Cloud_bddPrintCube(CloudManager *, CloudNode *)");
      }
    }
    printf(__format,(ulong)bCube->v);
    uVar1 = *(uint *)(((ulong)pCVar3 & 0xfffffffffffffffe) + 4);
    bCube = pCVar3;
  } while( true );
}

Assistant:

void Cloud_bddPrintCube( CloudManager * dd, CloudNode * bCube )
{
    CloudNode * bCube0, * bCube1;

    assert( !Cloud_IsConstant(bCube) );
    while ( 1 )
    {
        // get the node structure
        if ( Cloud_IsConstant(bCube) )
            break;

        // cofactor the cube
        if ( Cloud_IsComplement(bCube) )
        {
            bCube0 = Cloud_Not( cloudE(bCube) );
            bCube1 = Cloud_Not( cloudT(bCube) );
        }
        else
        {
            bCube0 = cloudE(bCube);
            bCube1 = cloudT(bCube);
        }

        if ( bCube0 != dd->zero )
        {
            assert( bCube1 == dd->zero );
            printf( "[%d]'", cloudV(bCube) );
            bCube = bCube0;
        }
        else
        {
            assert( bCube1 != dd->zero );
            printf( "[%d]", cloudV(bCube) );
            bCube = bCube1;
        }
    }
}